

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional.hpp
# Opt level: O0

result_type
boost::numeric::ublas::
vector_inner_prod<boost::numeric::ublas::compressed_vector<double,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>,double>
::
apply<boost::numeric::ublas::compressed_vector<double,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::const_iterator,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>::const_iterator>
          (const_iterator *param_1,const_iterator *param_2,const_iterator *param_3,
          const_iterator *param_4)

{
  double dVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  const_reference pdVar5;
  const_reference pdVar6;
  const_iterator *pcVar7;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  const_iterator *__s;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  result_type t;
  derived_iterator_type *in_stack_ffffffffffffff78;
  const_iterator *in_stack_ffffffffffffff80;
  const_iterator *in_stack_ffffffffffffff88;
  const_iterator *in_stack_ffffffffffffff90;
  result_type local_30;
  
  local_30 = 0.0;
  bVar2 = bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
          ::operator!=((bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
                        *)in_stack_ffffffffffffff80,
                       (derived_iterator_type *)in_stack_ffffffffffffff78);
  if ((bVar2) &&
     (__s = param_4,
     bVar2 = random_access_iterator_base<boost::numeric::ublas::dense_random_access_iterator_tag,_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>::const_iterator,_double,_long>
             ::operator!=((random_access_iterator_base<boost::numeric::ublas::dense_random_access_iterator_tag,_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>::const_iterator,_double,_long>
                           *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78),
     uVar8 = extraout_RDX, bVar2)) {
    do {
      do {
        while( true ) {
          while( true ) {
            pcVar3 = compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     ::const_iterator::index(param_1,(char *)__s,(int)uVar8);
            pcVar4 = matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                     ::const_iterator::index(param_3,(char *)__s,__c);
            if (pcVar3 != pcVar4) break;
            pdVar5 = compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     ::const_iterator::operator*((const_iterator *)in_stack_ffffffffffffff90);
            dVar1 = *pdVar5;
            pdVar6 = matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                     ::const_iterator::operator*((const_iterator *)0x918b00);
            auVar10._8_8_ = 0;
            auVar10._0_8_ = dVar1;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *pdVar6;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = local_30;
            auVar9 = vfmadd213sd_fma(auVar9,auVar10,auVar11);
            local_30 = auVar9._0_8_;
            compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::const_iterator::operator++(param_1);
            matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
            ::const_iterator::operator++(in_stack_ffffffffffffff80);
            bVar2 = compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    ::const_iterator::operator==(param_1,(const_iterator *)param_2);
            if (bVar2) {
              return local_30;
            }
            __s = param_4;
            bVar2 = matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                    ::const_iterator::operator==
                              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
            uVar8 = extraout_RDX_00;
            if (bVar2) {
              return local_30;
            }
          }
          pcVar3 = compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::const_iterator::index(param_1,(char *)__s,__c_00);
          pcVar4 = matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                   ::const_iterator::index(param_3,(char *)__s,__c_01);
          if (pcVar4 <= pcVar3) break;
          matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
          ::const_iterator::index(param_3,(char *)__s,__c_02);
          compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator::index(param_1,(char *)__s,__c_03);
          increment<boost::numeric::ublas::compressed_vector<double,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::const_iterator>
                    ((const_iterator *)in_stack_ffffffffffffff90,
                     (const_iterator *)in_stack_ffffffffffffff88,
                     (difference_type)in_stack_ffffffffffffff80);
          __s = param_2;
          bVar2 = compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  ::const_iterator::operator==(param_1,(const_iterator *)param_2);
          uVar8 = extraout_RDX_01;
          if (bVar2) {
            return local_30;
          }
        }
        in_stack_ffffffffffffff90 =
             (const_iterator *)
             compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::const_iterator::index(param_1,(char *)__s,__c_02);
        pcVar7 = (const_iterator *)
                 matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                 ::const_iterator::index(param_3,(char *)__s,__c_04);
        uVar8 = extraout_RDX_02;
      } while (in_stack_ffffffffffffff90 <= pcVar7);
      in_stack_ffffffffffffff88 = param_4;
      in_stack_ffffffffffffff80 =
           (const_iterator *)
           compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           ::const_iterator::index(param_1,(char *)__s,(int)extraout_RDX_02);
      matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
      ::const_iterator::index(param_3,(char *)__s,__c_05);
      increment<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>::const_iterator>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (difference_type)in_stack_ffffffffffffff80);
      __s = param_4;
      bVar2 = matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
              ::const_iterator::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      uVar8 = extraout_RDX_03;
    } while (!bVar2);
  }
  return local_30;
}

Assistant:

static BOOST_UBLAS_INLINE
        result_type apply (I1 it1, const I1 &it1_end, I2 it2, const I2 &it2_end, sparse_bidirectional_iterator_tag) {
            result_type t = result_type (0);
            if (it1 != it1_end && it2 != it2_end) {
                while (true) {
                    if (it1.index () == it2.index ()) {
                        t += *it1 * *it2, ++ it1, ++ it2;
                        if (it1 == it1_end || it2 == it2_end)
                            break;
                    } else if (it1.index () < it2.index ()) {
                        increment (it1, it1_end, it2.index () - it1.index ());
                        if (it1 == it1_end)
                            break;
                    } else if (it1.index () > it2.index ()) {
                        increment (it2, it2_end, it1.index () - it2.index ());
                        if (it2 == it2_end)
                            break;
                    }
                }
            }
            return t;
        }